

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int check_hosts(X509 *x,X509_VERIFY_PARAM *param)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  size_t chklen;
  char *name;
  size_t n;
  size_t i;
  X509_VERIFY_PARAM *param_local;
  X509 *x_local;
  
  sVar2 = sk_OPENSSL_STRING_num(param->hosts);
  n = 0;
  while( true ) {
    if (sVar2 <= n) {
      return (uint)(sVar2 == 0);
    }
    __s = sk_OPENSSL_STRING_value(param->hosts,n);
    chklen = strlen(__s);
    iVar1 = X509_check_host(x,__s,chklen,param->hostflags,(char **)0x0);
    if (0 < iVar1) break;
    n = n + 1;
  }
  return 1;
}

Assistant:

static int check_hosts(X509 *x, X509_VERIFY_PARAM *param) {
  size_t i;
  size_t n = sk_OPENSSL_STRING_num(param->hosts);
  char *name;

  for (i = 0; i < n; ++i) {
    name = sk_OPENSSL_STRING_value(param->hosts, i);
    if (X509_check_host(x, name, strlen(name), param->hostflags, NULL) > 0) {
      return 1;
    }
  }
  return n == 0;
}